

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::predict
          (Model *this,vector<int,_std::allocator<int>_> *input,int32_t k,real threshold,
          Predictions *heap,State *state)

{
  int64_t iVar1;
  invalid_argument *this_00;
  element_type *peVar2;
  undefined8 in_RCX;
  uint in_EDX;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RSI;
  State *in_RDI;
  undefined8 in_R8;
  uint in_XMM0_Da;
  Matrix *in_stack_ffffffffffffffc8;
  Model *in_stack_ffffffffffffffd0;
  
  if (in_EDX == 0xffffffff) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1e5341);
    iVar1 = Matrix::size(in_stack_ffffffffffffffc8,(int64_t)in_RDI);
    in_EDX = (uint)iVar1;
  }
  else if ((int)in_EDX < 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"k needs to be 1 or higher!");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::reserve
            (in_RSI,CONCAT44(in_EDX,in_XMM0_Da));
  computeHidden(in_stack_ffffffffffffffd0,
                (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc8,in_RDI);
  peVar2 = std::__shared_ptr_access<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1e53e4);
  (*peVar2->_vptr_Loss[4])((ulong)in_XMM0_Da,peVar2,(ulong)in_EDX,in_RCX,in_R8);
  return;
}

Assistant:

void Model::predict(
    const std::vector<int32_t>& input,
    int32_t k,
    real threshold,
    Predictions& heap,
    State& state) const {
  if (k == Model::kUnlimitedPredictions) {
    k = wo_->size(0); // output size
  } else if (k <= 0) {
    throw std::invalid_argument("k needs to be 1 or higher!");
  }
  heap.reserve(k + 1);
  computeHidden(input, state);

  loss_->predict(k, threshold, heap, state);
}